

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding-conversion.cc
# Opt level: O0

size_t __thiscall
EncodingConversion::encode
          (EncodingConversion *this,u16string *string,size_t *start_offset,size_t end_offset,
          char *output_buffer,size_t output_length,bool is_at_end)

{
  int iVar1;
  char16_t *pcVar2;
  char *output_end_00;
  char *local_80;
  char *replacement_text;
  uint local_70;
  uint16_t replacement_characters [2];
  int conversion_result;
  bool done;
  char *output_end;
  char *output_pointer;
  char *input_pointer;
  char *input_end;
  char *input_start;
  size_t sStack_38;
  bool is_at_end_local;
  size_t output_length_local;
  char *output_buffer_local;
  size_t end_offset_local;
  size_t *start_offset_local;
  u16string *string_local;
  EncodingConversion *this_local;
  
  input_start._7_1_ = is_at_end;
  sStack_38 = output_length;
  output_length_local = (size_t)output_buffer;
  output_buffer_local = (char *)end_offset;
  end_offset_local = (size_t)start_offset;
  start_offset_local = (size_t *)string;
  string_local = (u16string *)this;
  pcVar2 = std::__cxx11::
           basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>::data
                     (string);
  input_end = (char *)(pcVar2 + *(long *)end_offset_local);
  pcVar2 = std::__cxx11::
           basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>::data
                     ((basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>
                       *)start_offset_local);
  input_pointer = (char *)(pcVar2 + (long)output_buffer_local);
  output_pointer = input_end;
  output_end = (char *)output_length_local;
  output_end_00 = (char *)(output_length_local + sStack_38);
  replacement_characters[1]._1_1_ = 0;
  while (((replacement_characters[1]._1_1_ ^ 0xff) & 1) != 0) {
    local_70 = convert(this,&output_pointer,input_pointer,&output_end,output_end_00);
    if (local_70 < 2) {
      replacement_characters[1]._1_1_ = 1;
    }
    else if ((local_70 == 2) ||
            ((local_70 == 3 && (replacement_characters[1]._1_1_ = 1, (input_start._7_1_ & 1) != 0)))
            ) {
      replacement_text._4_4_ = 0xfffd;
      local_80 = (char *)((long)&replacement_text + 4);
      iVar1 = convert(this,&local_80,(char *)((long)&replacement_text + 6),&output_end,output_end_00
                     );
      if (iVar1 == 0) {
        output_pointer = output_pointer + 2;
      }
      else {
        replacement_characters[1]._1_1_ = 1;
      }
    }
  }
  *(long *)end_offset_local =
       ((long)output_pointer - (long)input_end) / 2 + *(long *)end_offset_local;
  return (long)output_end - output_length_local;
}

Assistant:

size_t EncodingConversion::encode(const u16string &string, size_t *start_offset,
                                  size_t end_offset, char *output_buffer,
                                  size_t output_length, bool is_at_end) {
  const char *input_start = reinterpret_cast<const char *>(string.data() + *start_offset);
  const char *input_end = reinterpret_cast<const char *>(string.data() + end_offset);
  const char *input_pointer = input_start;
  char *output_pointer = output_buffer;
  char *output_end = output_buffer + output_length;

  bool done = false;
  while (!done) {
    int conversion_result = convert(
      &input_pointer,
      input_end,
      &output_pointer,
      output_end
    );

    switch (conversion_result) {
      case Ok:
      case Partial:
        done = true;
        break;

      case InvalidTrailing:
        done = true;
        if (!is_at_end) break;

      case Invalid:
        uint16_t replacement_characters[] = {replacement_character, 0};
        const char *replacement_text = reinterpret_cast<const char *>(replacement_characters);
        if (convert(
          &replacement_text,
          replacement_text + bytes_per_character,
          &output_pointer,
          output_end
        ) != Ok) {
          done = true;
        } else {
          input_pointer += bytes_per_character;
        }
        break;
    }
  }

  *start_offset += (input_pointer - input_start) / bytes_per_character;
  return output_pointer - output_buffer;
}